

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

void bam_plp_destroy(bam_plp_t iter)

{
  int iVar1;
  olap_hash_t *__ptr;
  mempool_t *pmVar2;
  lbnode_t *plVar3;
  bam1_t *__ptr_00;
  int iVar4;
  lbnode_t **pplVar5;
  long lVar6;
  
  __ptr = iter->overlaps;
  if (__ptr != (olap_hash_t *)0x0) {
    free(__ptr->keys);
    free(__ptr->flags);
    free(__ptr->vals);
    free(__ptr);
  }
  pmVar2 = iter->mp;
  plVar3 = iter->dummy;
  pmVar2->cnt = pmVar2->cnt + -1;
  plVar3->next = (__linkbuf_t *)0x0;
  iVar1 = pmVar2->max;
  if (pmVar2->n == iVar1) {
    iVar4 = 0x100;
    if (iVar1 != 0) {
      iVar4 = iVar1 * 2;
    }
    pmVar2->max = iVar4;
    pplVar5 = (lbnode_t **)realloc(pmVar2->buf,(long)iVar4 << 3);
    pmVar2->buf = pplVar5;
  }
  iVar1 = pmVar2->n;
  pmVar2->n = iVar1 + 1;
  pmVar2->buf[iVar1] = plVar3;
  pmVar2 = iter->mp;
  plVar3 = iter->head;
  pmVar2->cnt = pmVar2->cnt + -1;
  plVar3->next = (__linkbuf_t *)0x0;
  iVar1 = pmVar2->max;
  if (pmVar2->n == iVar1) {
    iVar4 = 0x100;
    if (iVar1 != 0) {
      iVar4 = iVar1 * 2;
    }
    pmVar2->max = iVar4;
    pplVar5 = (lbnode_t **)realloc(pmVar2->buf,(long)iVar4 << 3);
    pmVar2->buf = pplVar5;
  }
  iVar1 = pmVar2->n;
  pmVar2->n = iVar1 + 1;
  pmVar2->buf[iVar1] = plVar3;
  if (iter->mp->cnt != 0) {
    fprintf(_stderr,"[bam_plp_destroy] memory leak: %d. Continue anyway.\n");
  }
  pmVar2 = iter->mp;
  if (0 < pmVar2->n) {
    lVar6 = 0;
    do {
      free((pmVar2->buf[lVar6]->b).data);
      free(pmVar2->buf[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 < pmVar2->n);
  }
  free(pmVar2->buf);
  free(pmVar2);
  __ptr_00 = iter->b;
  if (__ptr_00 != (bam1_t *)0x0) {
    free(__ptr_00->data);
    free(__ptr_00);
  }
  free(iter->plp);
  free(iter);
  return;
}

Assistant:

void bam_plp_destroy(bam_plp_t iter)
{
    if ( iter->overlaps ) kh_destroy(olap_hash, iter->overlaps);
    mp_free(iter->mp, iter->dummy);
    mp_free(iter->mp, iter->head);
    if (iter->mp->cnt != 0)
        fprintf(stderr, "[bam_plp_destroy] memory leak: %d. Continue anyway.\n", iter->mp->cnt);
    mp_destroy(iter->mp);
    if (iter->b) bam_destroy1(iter->b);
    free(iter->plp);
    free(iter);
}